

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

QStringList * QCoreApplication::arguments(void)

{
  int iVar1;
  QObjectData *pQVar2;
  QDynamicMetaObjectData *pQVar3;
  _func_int **pp_Var4;
  int *piVar5;
  DataPointer *pDVar6;
  QString *pQVar7;
  int *piVar8;
  QString *this;
  QList<QString> *in_RDI;
  long lVar9;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  if (self == (QCoreApplication *)0x0) {
    local_50.context.version = 2;
    local_50.context.line = 0;
    local_50.context.file._0_4_ = 0;
    local_50.context._12_8_ = 0;
    local_50.context.function._4_4_ = 0;
    local_50.context.category = "default";
    QMessageLogger::warning
              (&local_50,
               "QCoreApplication::arguments: Please instantiate the QApplication object first");
  }
  else {
    pQVar2 = (self->super_QObject).d_ptr.d;
    piVar8 = *(int **)&pQVar2[1].field_0x30;
    pQVar3 = pQVar2[1].metaObject;
    iVar1 = *piVar8;
    QList<QString>::reserve(in_RDI,(long)iVar1);
    if (0 < iVar1) {
      lVar9 = 0;
      do {
        pp_Var4 = pQVar3[lVar9]._vptr_QDynamicMetaObjectData;
        if (pp_Var4 == (_func_int **)0x0) {
          this = (QString *)0x0;
        }
        else {
          pQVar7 = (QString *)0xffffffffffffffff;
          do {
            this = (QString *)((long)&(pQVar7->d).d + 1);
            pDVar6 = &pQVar7->d;
            pQVar7 = this;
          } while (*(char *)((long)pp_Var4 + (long)((long)&pDVar6->d + 1)) != '\0');
        }
        ba.m_data = (storage_type *)piVar8;
        ba.m_size = (qsizetype)pp_Var4;
        QString::fromLocal8Bit((QString *)&local_50,this,ba);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,(QString *)&local_50);
        QList<QString>::end(in_RDI);
        piVar5 = (int *)CONCAT44(local_50.context.line,local_50.context.version);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_50.context.line,local_50.context.version),2,0x10
                      );
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QCoreApplication::arguments()
{
    QStringList list;

    if (!self) {
        qWarning("QCoreApplication::arguments: Please instantiate the QApplication object first");
        return list;
    }

    const QCoreApplicationPrivate *d = self->d_func();

    const int argc = d->argc;
    char ** const argv = d->argv;
    list.reserve(argc);

#if defined(Q_OS_WIN)
    const bool argsModifiedByUser = d->origArgv == nullptr;
    if (!argsModifiedByUser) {
        QStringList commandLineArguments = winCmdArgs();

        // Even if the user didn't modify argv before passing them
        // on to QCoreApplication, derived QApplications might have.
        // If that's the case argc will differ from origArgc.
        if (argc != d->origArgc) {
            // Note: On MingGW the arguments from GetCommandLine are
            // not wildcard expanded (if wildcard expansion is enabled),
            // as opposed to the arguments in argv. This means we can't
            // compare commandLineArguments to argv/origArgc, but
            // must remove elements by value, based on whether they
            // were filtered out from argc.
            for (int i = 0; i < d->origArgc; ++i) {
                if (!contains(argc, argv, d->origArgv[i]))
                    commandLineArguments.removeAll(QString::fromLocal8Bit(d->origArgv[i]));
            }
        }

        return commandLineArguments;
    } // Fall back to rebuilding from argv/argc when a modified argv was passed.
#endif // defined(Q_OS_WIN)

    for (int a = 0; a < argc; ++a)
        list << QString::fromLocal8Bit(argv[a]);

    return list;
}